

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O0

void __thiscall
google::protobuf::io::Printer::Annotate
          (Printer *this,char *begin_varname,char *end_varname,string *file_name)

{
  undefined1 local_40 [8];
  vector<int,_std::allocator<int>_> empty_path;
  string *file_name_local;
  char *end_varname_local;
  char *begin_varname_local;
  Printer *this_local;
  
  if (this->annotation_collector_ != (AnnotationCollector *)0x0) {
    empty_path.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)file_name;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_40);
    Annotate(this,begin_varname,end_varname,
             (string *)
             empty_path.super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,(vector<int,_std::allocator<int>_> *)local_40
            );
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  }
  return;
}

Assistant:

void Annotate(const char* begin_varname, const char* end_varname,
                const string& file_name) {
    if (annotation_collector_ == NULL) {
      // Annotations aren't turned on for this Printer.
      return;
    }
    std::vector<int> empty_path;
    Annotate(begin_varname, end_varname, file_name, empty_path);
  }